

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O3

void Abc_NodeCheckDist1Free(Abc_Obj_t *pNode)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  
  pcVar3 = (char *)(pNode->field_5).pData;
  if (*pcVar3 != '\0') {
    uVar2 = (pNode->vFanins).nSize;
    lVar4 = (long)(int)uVar2 + 3;
    pcVar6 = pcVar3;
    pcVar5 = pcVar3;
    do {
      if (pcVar5 != pcVar6) {
        if ((int)uVar2 < 1) {
LAB_0084dc7a:
          __assert_fail("Counter > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                        ,0x26c,"void Abc_NodeCheckDist1Free(Abc_Obj_t *)");
        }
        uVar7 = 0;
        uVar8 = 0;
        do {
          uVar8 = uVar8 + (pcVar5[uVar7] != pcVar6[uVar7]);
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
        if (uVar8 < 2) goto LAB_0084dc7a;
      }
      pcVar1 = pcVar6 + lVar4;
      pcVar6 = pcVar6 + lVar4;
    } while ((*pcVar1 != '\0') ||
            (pcVar1 = pcVar5 + lVar4, pcVar5 = pcVar5 + lVar4, pcVar6 = pcVar3, *pcVar1 != '\0'));
  }
  return;
}

Assistant:

void Abc_NodeCheckDist1Free( Abc_Obj_t * pNode )
{
    char * pSop = (char *)pNode->pData;
    char * pCube, * pCube2;
    int i, nVars = Abc_ObjFaninNum(pNode);
    Abc_SopForEachCube( pSop, nVars, pCube )
    Abc_SopForEachCube( pSop, nVars, pCube2 )
    {
        int Counter = 0;
        if ( pCube == pCube2 )
            continue;
        for ( i = 0; i < nVars; i++ )
            if ( pCube[i] != pCube2[i] )
                Counter++;
        assert( Counter > 1 );
    }
}